

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int quicly_send(quicly_conn_t *conn,quicly_address_t *dest,quicly_address_t *src,iovec *datagrams,
               size_t *num_datagrams,void *buf,size_t bufsize)

{
  uint64_t *puVar1;
  char cVar2;
  ushort uVar3;
  quicly_state_t qVar4;
  ptls_t *ppVar5;
  st_quicly_application_space_t *space;
  ptls_cipher_context_t *ppVar6;
  st_quicly_pending_path_challenge_t *__ptr;
  _func_void_void_ptr_char_ptr_varargs *p_Var7;
  void *pvVar8;
  st_quicly_stream_scheduler_t *psVar9;
  _func_int_st_quicly_stream_scheduler_t_ptr_quicly_conn_t_ptr_quicly_send_context_t_ptr *p_Var10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  quicly_sent_acked_cb *pp_Var14;
  byte bVar15;
  int iVar16;
  int iVar17;
  int64_t iVar18;
  st_quicly_pn_space_t *psVar19;
  uint8_t *puVar20;
  size_t *psVar21;
  quicly_stream_t *stream;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  st_quicly_sent_block_t **__src;
  size_t sVar26;
  bool bVar27;
  uint32_t uVar28;
  en_quicly_send_packet_mode_t mode;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  anon_union_24_13_c7673ae4_for_data *sent;
  uint64_t uVar32;
  size_t sVar33;
  size_t sVar34;
  char *buf_00;
  _st_quicly_conn_public_t *c;
  char *pcVar35;
  uint64_t error_code;
  long lVar36;
  ulong uVar37;
  st_quicly_local_cid_t *new_cid;
  bool bVar38;
  undefined8 uStack_110;
  char acStack_108 [8];
  quicly_address_t *local_100;
  size_t local_f8;
  ulong local_f0;
  undefined1 local_e8 [88];
  uint8_t *puStack_90;
  uint8_t *puStack_88;
  undefined1 local_78 [8];
  quicly_sentmap_iter_t iter;
  
  buf_00 = acStack_108;
  iVar16 = 0;
  local_e8._0_8_ = (st_quicly_cipher_context_t *)0x0;
  local_e8[8] = 0xff;
  local_e8._16_8_ = (st_quicly_cipher_context_t *)0x0;
  local_e8._24_8_ = (uint8_t *)0x0;
  local_e8._32_8_ = 0;
  local_e8._48_8_ = *num_datagrams;
  local_e8._56_8_ = 0;
  local_e8._72_8_ = (long)buf + bufsize;
  register0x00001200 = ZEXT432(0) << 0x40;
  uStack_110 = 0x1247e4;
  local_100 = dest;
  local_e8._40_8_ = datagrams;
  local_e8._64_8_ = buf;
  lock_now(conn,0);
  lVar36 = (conn->stash).now;
  uStack_110 = 0x1247f4;
  iVar18 = quicly_get_first_timeout(conn);
  if (lVar36 < iVar18) goto LAB_00124f56;
  buf_00 = acStack_108;
  if (quicly_trace_fp != (FILE *)0x0) {
    uStack_110 = 0x1254ae;
    iVar16 = ptls_skip_tracing((conn->crypto).tls);
    buf_00 = acStack_108;
    if (iVar16 == 0) {
      iVar18 = (conn->stash).now;
      qVar4 = (conn->super).state;
      bVar15 = (conn->super).remote.cid_set.cids[0].cid.len;
      lVar36 = -(ulong)((uint)bVar15 * 2 + 0x10 & 0xfffffff0);
      buf_00 = acStack_108 + lVar36;
      *(undefined8 *)((long)&uStack_110 + lVar36) = 0x1254f0;
      pcVar35 = ptls_hexdump(buf_00,&(conn->super).remote.cid_set.cids[0].cid,(ulong)bVar15);
      if (conn == (quicly_conn_t *)0x0) {
        uVar37 = 0;
      }
      else {
        uVar37 = (ulong)(conn->super).local.cid_set.plaintext.master_id;
      }
      *(undefined8 *)((long)&uStack_110 + lVar36) = 0x125528;
      fprintf((FILE *)quicly_trace_fp,
              "{\"type\":\"send\", \"conn\":%u, \"time\":%lld, \"state\":%lld, \"dcid\":\"%s\"}\n",
              uVar37,iVar18,(long)(int)qVar4,pcVar35);
    }
  }
  if (QUICLY_STATE_CONNECTED < (conn->super).state) {
    iVar18 = (conn->stash).now;
    uVar3 = (conn->super).remote.transport_params.max_ack_delay;
    builtin_strncpy(buf_00 + -8,"FH\x12",4);
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    quicly_loss_init_sentmap_iter
              (&(conn->egress).loss,(quicly_sentmap_iter_t *)local_78,iVar18,(uint)uVar3,1);
    qVar4 = (conn->super).state;
    if ((qVar4 == QUICLY_STATE_DRAINING) ||
       ((conn->super).stats.num_frames_sent.transport_close +
        (conn->super).stats.num_frames_sent.application_close != 0)) {
      if ((st_quicly_sent_block_t *)*(quicly_sent_acked_cb *)local_78 !=
          (st_quicly_sent_block_t *)quicly_sentmap__type_packet) goto LAB_0012570f;
      if ((((anon_union_24_13_c7673ae4_for_data *)((long)local_78 + 8))->packet).packet_number !=
          0xffffffffffffffff) goto LAB_00124881;
      if ((conn->super).local.uni.num_streams + (conn->super).local.bidi.num_streams +
          (conn->super).remote.bidi.num_streams + (conn->super).remote.uni.num_streams != 0) {
        builtin_strncpy(buf_00 + -8,"3X\x12",4);
        buf_00[-4] = '\0';
        buf_00[-3] = '\0';
        buf_00[-2] = '\0';
        buf_00[-1] = '\0';
        __assert_fail("quicly_num_streams(conn) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x1156,
                      "int quicly_send(quicly_conn_t *, quicly_address_t *, quicly_address_t *, struct iovec *, size_t *, void *, size_t)"
                     );
      }
      iVar17 = 2;
      iVar16 = 0xff03;
    }
    else {
LAB_00124881:
      if ((qVar4 == QUICLY_STATE_CLOSING) && ((conn->egress).send_ack_at <= (conn->stash).now)) {
        bVar38 = false;
        buf_00[-8] = -0xf;
        buf_00[-7] = 'J';
        buf_00[-6] = '\x12';
        buf_00[-5] = '\0';
        buf_00[-4] = '\0';
        buf_00[-3] = '\0';
        buf_00[-2] = '\0';
        buf_00[-1] = '\0';
        destroy_all_streams(conn,0,0);
        uVar37 = 0;
        do {
          builtin_strncpy(buf_00 + -8,"\nK\x12",4);
          buf_00[-4] = '\0';
          buf_00[-3] = '\0';
          buf_00[-2] = '\0';
          buf_00[-1] = '\0';
          psVar19 = setup_send_space(conn,uVar37,(quicly_send_context_t *)local_e8);
          iVar16 = 0;
          if (psVar19 != (st_quicly_pn_space_t *)0x0) {
            error_code = (uint64_t)(conn->egress).connection_close.error_code;
            uVar32 = (conn->egress).connection_close.frame_type;
            pcVar35 = (conn->egress).connection_close.reason_phrase;
            if (uVar32 == 0xffffffffffffffff) {
              bVar27 = true;
              if ((char)local_e8[8] < '\0') {
                bVar15 = local_e8[8] & 0xf0;
                if (bVar15 == 0xc0) {
                  bVar27 = false;
                }
                else if (bVar15 == 0xd0) {
                  bVar27 = true;
                }
                else {
                  if (bVar15 != 0xe0) {
                    builtin_strncpy(buf_00 + -8,"qX\x12",4);
                    buf_00[-4] = '\0';
                    buf_00[-3] = '\0';
                    buf_00[-2] = '\0';
                    buf_00[-1] = '\0';
                    __assert_fail("!\"FIXME\"",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                                  ,0x224,"uint8_t get_epoch(uint8_t)");
                  }
                  bVar27 = false;
                }
              }
              if (bVar27) {
                uVar32 = 0xffffffffffffffff;
              }
              else {
                error_code = 0x2000c;
                pcVar35 = "";
                uVar32 = 0;
              }
            }
            buf_00[-8] = -0x66;
            buf_00[-7] = 'K';
            buf_00[-6] = '\x12';
            buf_00[-5] = '\0';
            buf_00[-4] = '\0';
            buf_00[-3] = '\0';
            buf_00[-2] = '\0';
            buf_00[-1] = '\0';
            puVar20 = quicly_encode_close_frame((uint8_t *)0x0,error_code,uVar32,pcVar35);
            buf_00[-8] = -0x51;
            buf_00[-7] = 'K';
            buf_00[-6] = '\x12';
            buf_00[-5] = '\0';
            buf_00[-4] = '\0';
            buf_00[-3] = '\0';
            buf_00[-2] = '\0';
            buf_00[-1] = '\0';
            iVar16 = _do_allocate_frame(conn,(quicly_send_context_t *)local_e8,(size_t)puVar20,0);
            if (iVar16 == 0) {
              puVar20 = puStack_90;
              buf_00[-8] = -0x2a;
              buf_00[-7] = 'K';
              buf_00[-6] = '\x12';
              buf_00[-5] = '\0';
              buf_00[-4] = '\0';
              buf_00[-3] = '\0';
              buf_00[-2] = '\0';
              buf_00[-1] = '\0';
              puVar20 = quicly_encode_close_frame(puVar20,error_code,uVar32,pcVar35);
              puStack_90 = puVar20;
              if (uVar32 == 0xffffffffffffffff) {
                puVar1 = &(conn->super).stats.num_frames_sent.application_close;
                *puVar1 = *puVar1 + 1;
                iVar16 = 0;
                if (quicly_trace_fp != (FILE *)0x0) {
                  ppVar5 = (conn->crypto).tls;
                  buf_00[-8] = -0x37;
                  buf_00[-7] = 'L';
                  buf_00[-6] = '\x12';
                  buf_00[-5] = '\0';
                  buf_00[-4] = '\0';
                  buf_00[-3] = '\0';
                  buf_00[-2] = '\0';
                  buf_00[-1] = '\0';
                  iVar17 = ptls_skip_tracing(ppVar5);
                  iVar16 = 0;
                  if (iVar17 == 0) {
                    iVar16 = 0;
                    uVar31 = 0;
                    if (conn != (quicly_conn_t *)0x0) {
                      uVar31 = (ulong)(conn->super).local.cid_set.plaintext.master_id;
                    }
                    iVar18 = (conn->stash).now;
                    builtin_strncpy(buf_00 + -8,"\x11M\x12",4);
                    buf_00[-4] = '\0';
                    buf_00[-3] = '\0';
                    buf_00[-2] = '\0';
                    buf_00[-1] = '\0';
                    fprintf((FILE *)quicly_trace_fp,
                            "{\"type\":\"application-close-send\", \"conn\":%u, \"time\":%lld, \"error-code\":%llu, \"reason-phrase\":\"%s\"}\n"
                            ,uVar31,iVar18,error_code,pcVar35);
                  }
                }
              }
              else {
                puVar1 = &(conn->super).stats.num_frames_sent.transport_close;
                *puVar1 = *puVar1 + 1;
                iVar16 = 0;
                if (quicly_trace_fp != (FILE *)0x0) {
                  ppVar5 = (conn->crypto).tls;
                  builtin_strncpy(buf_00 + -8,"\x13L\x12",4);
                  buf_00[-4] = '\0';
                  buf_00[-3] = '\0';
                  buf_00[-2] = '\0';
                  buf_00[-1] = '\0';
                  iVar17 = ptls_skip_tracing(ppVar5);
                  iVar16 = 0;
                  if (iVar17 == 0) {
                    iVar16 = 0;
                    uVar31 = 0;
                    if (conn != (quicly_conn_t *)0x0) {
                      uVar31 = (ulong)(conn->super).local.cid_set.plaintext.master_id;
                    }
                    iVar18 = (conn->stash).now;
                    *(char **)(buf_00 + -0x10) = pcVar35;
                    buf_00[-0x18] = 'a';
                    buf_00[-0x17] = 'L';
                    buf_00[-0x16] = '\x12';
                    buf_00[-0x15] = '\0';
                    buf_00[-0x14] = '\0';
                    buf_00[-0x13] = '\0';
                    buf_00[-0x12] = '\0';
                    buf_00[-0x11] = '\0';
                    fprintf((FILE *)quicly_trace_fp,
                            "{\"type\":\"transport-close-send\", \"conn\":%u, \"time\":%lld, \"error-code\":%llu, \"frame-type\":%llu, \"reason-phrase\":\"%s\"}\n"
                            ,uVar31,iVar18,error_code,uVar32);
                  }
                }
              }
            }
          }
          if (iVar16 != 0) {
            iVar17 = 2;
            goto LAB_00124f20;
          }
          bVar38 = 2 < uVar37;
          uVar37 = uVar37 + 1;
        } while (uVar37 != 4);
        iVar17 = 5;
        iVar16 = 0;
LAB_00124f20:
        if (bVar38) {
          builtin_strncpy(buf_00 + -8,"AO\x12",4);
          buf_00[-4] = '\0';
          buf_00[-3] = '\0';
          buf_00[-2] = '\0';
          buf_00[-1] = '\0';
          iVar16 = commit_send_packet(conn,(quicly_send_context_t *)local_e8,
                                      QUICLY_COMMIT_SEND_PACKET_MODE_SMALL);
          if (iVar16 == 0) goto LAB_0012489c;
          iVar17 = 2;
        }
      }
      else {
LAB_0012489c:
        if ((st_quicly_sent_block_t *)*(quicly_sent_acked_cb *)local_78 !=
            (st_quicly_sent_block_t *)quicly_sentmap__type_packet) {
LAB_0012570f:
          builtin_strncpy(buf_00 + -8,".W\x12",4);
          buf_00[-4] = '\0';
          buf_00[-3] = '\0';
          buf_00[-2] = '\0';
          buf_00[-1] = '\0';
          __assert_fail("iter->p->acked == quicly_sentmap__type_packet",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                        ,0x13c,
                        "const quicly_sent_packet_t *quicly_sentmap_get(quicly_sentmap_iter_t *)");
        }
        uVar28 = (conn->egress).loss.rtt.variance;
        if (uVar28 == 0) {
          uVar28 = ((conn->egress).loss.conf)->min_pto;
        }
        else {
          uVar28 = uVar28 << 2;
        }
        lVar25 = (((anon_union_24_13_c7673ae4_for_data *)((long)local_78 + 8))->packet).sent_at +
                 (ulong)(((uint)(conn->super).remote.transport_params.max_ack_delay +
                          (conn->egress).loss.rtt.smoothed + uVar28) * 4);
        (conn->egress).send_ack_at = lVar25;
        lVar36 = (conn->stash).now;
        iVar17 = 2;
        iVar16 = 0;
        if (lVar25 <= lVar36) {
          (conn->egress).send_ack_at = lVar36 + 1;
        }
      }
    }
    if (iVar17 != 2) {
      return iVar16;
    }
    goto LAB_00124f56;
  }
  iVar18 = (conn->stash).now;
  if (iVar18 < (conn->idle_timeout).at) {
    if (iVar18 < (conn->egress).loss.alarm_at) {
      bVar38 = false;
      uVar37 = 0;
LAB_00124912:
      uVar31 = 0xffffffffffffffff;
      if (((uint)(conn->super).remote.address_validation & 1) == 0) {
        uVar23 = (ulong)((conn->super).ctx)->pre_validation_amplification_limit *
                 (conn->super).stats.num_bytes.received;
        puVar1 = &(conn->super).stats.num_bytes.sent;
        uVar31 = 0;
        if (*puVar1 <= uVar23) {
          uVar31 = uVar23 - *puVar1;
        }
      }
      uVar23 = (conn->egress).max_udp_payload_size * uVar37;
      if (!bVar38) {
        uVar24 = (ulong)(conn->egress).cc.cwnd;
        psVar21 = &(conn->egress).loss.sentmap.bytes_in_flight;
        uVar30 = 0;
        if (*psVar21 <= uVar24) {
          uVar30 = uVar24 - *psVar21;
        }
        if (uVar23 < uVar30) {
          uVar23 = uVar30;
        }
      }
      if (uVar23 < uVar31) {
        uVar31 = uVar23;
      }
      local_e8._80_8_ = uVar31;
      bVar38 = uVar31 == 0;
      if (uVar37 == 0) {
        uVar22 = 0;
      }
      else {
        uVar22 = 1;
        if (((conn->super).local.bidi.next_stream_id & 1) == 0) {
          uVar22 = (uint)(conn->handshake == (st_quicly_handshake_space_t *)0x0);
        }
      }
      builtin_strncpy(buf_00 + -8,"bM\x12",4);
      buf_00[-4] = '\0';
      buf_00[-3] = '\0';
      buf_00[-2] = '\0';
      buf_00[-1] = '\0';
      iVar17 = send_handshake_flow(conn,0,(quicly_send_context_t *)local_e8,(uint)bVar38,uVar22);
      if (iVar17 == 0) {
        buf_00[-8] = -0x75;
        buf_00[-7] = 'M';
        buf_00[-6] = '\x12';
        buf_00[-5] = '\0';
        buf_00[-4] = '\0';
        buf_00[-3] = '\0';
        buf_00[-2] = '\0';
        buf_00[-1] = '\0';
        iVar17 = send_handshake_flow(conn,2,(quicly_send_context_t *)local_e8,(uint)bVar38,
                                     (uint)(uVar37 != 0));
        if (iVar17 == 0) {
          space = conn->application;
          iVar17 = 0;
          if (((space != (st_quicly_application_space_t *)0x0) &&
              (ppVar6 = (space->cipher).egress.key.header_protection,
              ppVar6 != (ptls_cipher_context_t *)0x0)) &&
             ((bVar15 = 0x40, space->one_rtt_writable != 0 ||
              ((ppVar6 != (ptls_cipher_context_t *)0x0 &&
               (bVar15 = 0xd0, space->one_rtt_writable != 1)))))) {
            local_e8._0_8_ = &(space->cipher).egress;
            local_e8[8] = bVar15;
            if ((space->one_rtt_writable != 0) &&
               (((conn->egress).send_ack_at <= (conn->stash).now &&
                ((space->super).unacked_count != 0)))) {
              builtin_strncpy(buf_00 + -8,"KP\x12",4);
              buf_00[-4] = '\0';
              buf_00[-3] = '\0';
              buf_00[-2] = '\0';
              buf_00[-1] = '\0';
              iVar17 = send_ack(conn,&space->super,(quicly_send_context_t *)local_e8);
              if (iVar17 != 0) goto LAB_00124d96;
            }
            iVar17 = 0;
            local_f0 = uVar37;
            if ((((conn->egress).datagram_frame_payloads.count != 0) &&
                (conn->application != (st_quicly_application_space_t *)0x0)) &&
               (iVar17 = 0,
               (conn->application->cipher).egress.key.aead != (ptls_aead_context_t *)0x0)) {
              psVar21 = &(conn->egress).datagram_frame_payloads.payloads[0].len;
              sVar26 = 0;
              do {
                uVar37 = *psVar21;
                lVar36 = 2;
                if ((0x3f < uVar37) && (lVar36 = 3, 0x3fff < uVar37)) {
                  lVar36 = (ulong)(0x3fffffff < uVar37) * 4 + 5;
                }
                uVar37 = lVar36 + uVar37;
                local_f8 = sVar26;
                buf_00[-8] = -0x16;
                buf_00[-7] = 'P';
                buf_00[-6] = '\x12';
                buf_00[-5] = '\0';
                buf_00[-4] = '\0';
                buf_00[-3] = '\0';
                buf_00[-2] = '\0';
                buf_00[-1] = '\0';
                iVar17 = _do_allocate_frame(conn,(quicly_send_context_t *)local_e8,uVar37,1);
                iVar29 = 4;
                if (iVar17 == 0) {
                  puVar20 = puStack_90;
                  if ((ulong)((long)puStack_88 - (long)puStack_90) < uVar37) {
                    puStack_90 = puStack_90 + 1;
                    *puVar20 = '\0';
LAB_00125117:
                    iVar29 = 0;
                  }
                  else {
                    __src = (st_quicly_sent_block_t **)((ptls_iovec_t *)(psVar21 + -1))->base;
                    uVar37 = *psVar21;
                    *puStack_90 = '1';
                    iter.ref = (st_quicly_sent_block_t **)(puStack_90 + 1);
                    if (0x3f < uVar37) {
                      if (uVar37 < 0x4000) {
                        puStack_90[1] = (byte)(uVar37 >> 8) | 0x40;
                        iter.ref = (st_quicly_sent_block_t **)(puStack_90 + 2);
                      }
                      else {
                        iter.ref = __src;
                        builtin_strncpy(buf_00 + -8,"0R\x12",4);
                        buf_00[-4] = '\0';
                        buf_00[-3] = '\0';
                        buf_00[-2] = '\0';
                        buf_00[-1] = '\0';
                        quicly_send_cold_3();
                        __src = iter.ref;
                        iter.ref = (st_quicly_sent_block_t **)local_78;
                      }
                    }
                    pp_Var14 = &((quicly_sent_t *)iter.ref)->acked;
                    *(char *)&((quicly_sent_t *)iter.ref)->acked = (char)uVar37;
                    builtin_strncpy(buf_00 + -8,"IQ\x12",4);
                    buf_00[-4] = '\0';
                    buf_00[-3] = '\0';
                    buf_00[-2] = '\0';
                    buf_00[-1] = '\0';
                    memcpy((undefined1 *)((long)pp_Var14 + 1),__src,uVar37);
                    puStack_90 = (uint8_t *)((long)iter.ref + uVar37 + 1);
                    iVar29 = 0;
                    if (quicly_trace_fp != (FILE *)0x0) {
                      ppVar5 = (conn->crypto).tls;
                      buf_00[-8] = -0x2a;
                      buf_00[-7] = 'Q';
                      buf_00[-6] = '\x12';
                      buf_00[-5] = '\0';
                      buf_00[-4] = '\0';
                      buf_00[-3] = '\0';
                      buf_00[-2] = '\0';
                      buf_00[-1] = '\0';
                      iVar16 = ptls_skip_tracing(ppVar5);
                      iVar29 = 0;
                      if (iVar16 == 0) {
                        uVar23 = 0;
                        if (conn != (quicly_conn_t *)0x0) {
                          uVar23 = (ulong)(conn->super).local.cid_set.plaintext.master_id;
                        }
                        iVar18 = (conn->stash).now;
                        puVar20 = ((ptls_iovec_t *)(psVar21 + -1))->base;
                        uVar30 = *psVar21;
                        builtin_strncpy(buf_00 + -8,"\x1cR\x12",4);
                        buf_00[-4] = '\0';
                        buf_00[-3] = '\0';
                        buf_00[-2] = '\0';
                        buf_00[-1] = '\0';
                        fprintf((FILE *)quicly_trace_fp,
                                "{\"type\":\"datagram-send\", \"conn\":%u, \"time\":%lld, \"payload\":\"0x%llx\", \"payload-len\":%llu}\n"
                                ,uVar23,iVar18,puVar20,uVar30);
                        goto LAB_00125117;
                      }
                    }
                  }
                }
                iVar16 = (int)uVar37;
                if (iVar17 != 0) goto LAB_001252cb;
                sVar26 = local_f8 + 1;
                psVar21 = psVar21 + 2;
              } while (sVar26 != (conn->egress).datagram_frame_payloads.count);
              iVar29 = 7;
LAB_001252cb:
              if (iVar29 == 4) goto LAB_00124d96;
              if (iVar29 != 7) goto LAB_00124e2e;
            }
            if (uVar31 != 0) {
              if (local_f0 != 0) {
                builtin_strncpy(buf_00 + -8,"\x10S\x12",4);
                buf_00[-4] = '\0';
                buf_00[-3] = '\0';
                buf_00[-2] = '\0';
                buf_00[-1] = '\0';
                iVar17 = _do_allocate_frame(conn,(quicly_send_context_t *)local_e8,1,1);
                if (iVar17 != 0) goto LAB_001252ba;
                puVar20 = puStack_90;
                puStack_90 = puStack_90 + 1;
                *puVar20 = '\x01';
                puVar1 = &(conn->super).stats.num_frames_sent.ping;
                *puVar1 = *puVar1 + 1;
                if (quicly_trace_fp != (FILE *)0x0) {
                  builtin_strncpy(buf_00 + -8,":W\x12",4);
                  buf_00[-4] = '\0';
                  buf_00[-3] = '\0';
                  buf_00[-2] = '\0';
                  buf_00[-1] = '\0';
                  quicly_send_cold_4();
                }
              }
              if (conn->application->one_rtt_writable == 0) {
LAB_001257ce:
                buf_00[-8] = -0x23;
                buf_00[-7] = 'W';
                buf_00[-6] = '\x12';
                buf_00[-5] = '\0';
                buf_00[-4] = '\0';
                buf_00[-3] = '\0';
                buf_00[-2] = '\0';
                buf_00[-1] = '\0';
                iVar17 = send_stream_control_frames(conn,(quicly_send_context_t *)local_e8);
                if (iVar17 == 0) {
                  psVar9 = ((conn->super).ctx)->stream_scheduler;
                  p_Var10 = psVar9->do_send;
                  buf_00[-8] = -7;
                  buf_00[-7] = 'W';
                  buf_00[-6] = '\x12';
                  buf_00[-5] = '\0';
                  buf_00[-4] = '\0';
                  buf_00[-3] = '\0';
                  buf_00[-2] = '\0';
                  buf_00[-1] = '\0';
                  iVar17 = (*p_Var10)(psVar9,conn,(quicly_send_context_t *)local_e8);
                  if (iVar17 == 0) {
                    builtin_strncpy(buf_00 + -8,"\fX\x12",4);
                    buf_00[-4] = '\0';
                    buf_00[-3] = '\0';
                    buf_00[-2] = '\0';
                    buf_00[-1] = '\0';
                    iVar17 = send_stream_control_frames(conn,(quicly_send_context_t *)local_e8);
                  }
                }
                goto LAB_001252ba;
              }
              if (((conn->egress).pending_flows & 0x40) != 0) {
                builtin_strncpy(buf_00 + -8,"nS\x12",4);
                buf_00[-4] = '\0';
                buf_00[-3] = '\0';
                buf_00[-2] = '\0';
                buf_00[-1] = '\0';
                iVar17 = send_handshake_done(conn,(quicly_send_context_t *)local_e8);
                if (iVar17 != 0) goto LAB_001252ba;
              }
              if (((conn->egress).pending_flows & 8) != 0) {
                buf_00[-8] = -0x70;
                buf_00[-7] = 'S';
                buf_00[-6] = '\x12';
                buf_00[-5] = '\0';
                buf_00[-4] = '\0';
                buf_00[-3] = '\0';
                buf_00[-2] = '\0';
                buf_00[-1] = '\0';
                stream = quicly_get_stream(conn,-4);
                if (stream == (quicly_stream_t *)0x0) {
                  *(code **)(buf_00 + -8) = commit_send_packet;
                  __assert_fail("stream != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                                ,0x10c2,"int do_send(quicly_conn_t *, quicly_send_context_t *)");
                }
                buf_00[-8] = -0x55;
                buf_00[-7] = 'S';
                buf_00[-6] = '\x12';
                buf_00[-5] = '\0';
                buf_00[-4] = '\0';
                buf_00[-3] = '\0';
                buf_00[-2] = '\0';
                buf_00[-1] = '\0';
                iVar17 = quicly_send_stream(stream,(quicly_send_context_t *)local_e8);
                if (iVar17 != 0) goto LAB_001252ba;
                buf_00[-8] = -0x45;
                buf_00[-7] = 'S';
                buf_00[-6] = '\x12';
                buf_00[-5] = '\0';
                buf_00[-4] = '\0';
                buf_00[-3] = '\0';
                buf_00[-2] = '\0';
                buf_00[-1] = '\0';
                resched_stream_data(stream);
              }
              if ((conn->egress).path_challenge.head != (st_quicly_pending_path_challenge_t *)0x0) {
                do {
                  __ptr = (conn->egress).path_challenge.head;
                  buf_00[-8] = -9;
                  buf_00[-7] = 'S';
                  buf_00[-6] = '\x12';
                  buf_00[-5] = '\0';
                  buf_00[-4] = '\0';
                  buf_00[-3] = '\0';
                  buf_00[-2] = '\0';
                  buf_00[-1] = '\0';
                  iVar17 = _do_allocate_frame(conn,(quicly_send_context_t *)local_e8,9,0);
                  if (iVar17 != 0) goto LAB_001252ba;
                  puVar20 = puStack_90;
                  bVar15 = __ptr->is_response;
                  builtin_strncpy(buf_00 + -8,"\x14T\x12",4);
                  buf_00[-4] = '\0';
                  buf_00[-3] = '\0';
                  buf_00[-2] = '\0';
                  buf_00[-1] = '\0';
                  puVar20 = quicly_encode_path_challenge_frame(puVar20,(uint)bVar15,__ptr->data);
                  puStack_90 = puVar20;
                  puVar1 = &(conn->super).stats.num_frames_sent.path_challenge +
                           (__ptr->is_response != '\0');
                  *puVar1 = *puVar1 + 1;
                  (conn->egress).path_challenge.head = __ptr->next;
                  builtin_strncpy(buf_00 + -8,"@T\x12",4);
                  buf_00[-4] = '\0';
                  buf_00[-3] = '\0';
                  buf_00[-2] = '\0';
                  buf_00[-1] = '\0';
                  free(__ptr);
                } while ((conn->egress).path_challenge.head !=
                         (st_quicly_pending_path_challenge_t *)0x0);
                (conn->egress).path_challenge.tail_ref = &(conn->egress).path_challenge.head;
              }
              builtin_strncpy(buf_00 + -8,"kT\x12",4);
              buf_00[-4] = '\0';
              buf_00[-3] = '\0';
              buf_00[-2] = '\0';
              buf_00[-1] = '\0';
              iVar17 = send_max_streams(conn,1,(quicly_send_context_t *)local_e8);
              if (iVar17 != 0) goto LAB_001252ba;
              bVar38 = false;
              buf_00[-8] = -0x72;
              buf_00[-7] = 'T';
              buf_00[-6] = '\x12';
              buf_00[-5] = '\0';
              buf_00[-4] = '\0';
              buf_00[-3] = '\0';
              buf_00[-2] = '\0';
              buf_00[-1] = '\0';
              iVar17 = send_max_streams(conn,0,(quicly_send_context_t *)local_e8);
              if (iVar17 != 0) goto LAB_00124d96;
              builtin_strncpy(buf_00 + -8,"@U\x12",4);
              buf_00[-4] = '\0';
              buf_00[-3] = '\0';
              buf_00[-2] = '\0';
              buf_00[-1] = '\0';
              iVar16 = should_send_max_data(conn);
              if (iVar16 == 0) {
LAB_001255f8:
                if ((conn->egress).data_blocked == QUICLY_SENDER_STATE_SEND) {
                  builtin_strncpy(buf_00 + -8,"\x15V\x12",4);
                  buf_00[-4] = '\0';
                  buf_00[-3] = '\0';
                  buf_00[-2] = '\0';
                  buf_00[-1] = '\0';
                  iVar17 = send_data_blocked(conn,(quicly_send_context_t *)local_e8);
                  if (iVar17 != 0) goto LAB_0012563c;
                }
                builtin_strncpy(buf_00 + -8,".V\x12",4);
                buf_00[-4] = '\0';
                buf_00[-3] = '\0';
                buf_00[-2] = '\0';
                buf_00[-1] = '\0';
                iVar17 = send_streams_blocked(conn,1,(quicly_send_context_t *)local_e8);
                if (iVar17 == 0) {
                  builtin_strncpy(buf_00 + -8,"rV\x12",4);
                  buf_00[-4] = '\0';
                  buf_00[-3] = '\0';
                  buf_00[-2] = '\0';
                  buf_00[-1] = '\0';
                  iVar17 = send_streams_blocked(conn,0,(quicly_send_context_t *)local_e8);
                  if (iVar17 == 0) {
                    if (((conn->egress).pending_flows & 0x20) != 0) {
                      buf_00[-8] = -0x68;
                      buf_00[-7] = 'V';
                      buf_00[-6] = '\x12';
                      buf_00[-5] = '\0';
                      buf_00[-4] = '\0';
                      buf_00[-3] = '\0';
                      buf_00[-2] = '\0';
                      buf_00[-1] = '\0';
                      iVar17 = send_resumption_token(conn,(quicly_send_context_t *)local_e8);
                      if (iVar17 != 0) goto LAB_0012563c;
                    }
                    if ((char)(conn->egress).pending_flows < '\0') {
                      sVar26 = (conn->super).local.cid_set._size;
                      if (sVar26 == 0) {
                        iVar17 = 0;
                        sVar34 = 0;
                      }
                      else {
                        new_cid = (conn->super).local.cid_set.cids;
                        sVar33 = 0;
                        iVar17 = 0;
                        do {
                          if (new_cid->state == QUICLY_LOCAL_CID_STATE_PENDING) {
                            buf_00[-8] = -0x12;
                            buf_00[-7] = 'V';
                            buf_00[-6] = '\x12';
                            buf_00[-5] = '\0';
                            buf_00[-4] = '\0';
                            buf_00[-3] = '\0';
                            buf_00[-2] = '\0';
                            buf_00[-1] = '\0';
                            iVar17 = send_new_connection_id
                                               (conn,(quicly_send_context_t *)local_e8,new_cid);
                            bVar38 = iVar17 == 0;
                          }
                          else {
                            bVar38 = false;
                          }
                          sVar34 = sVar33;
                          if (!bVar38) break;
                          sVar33 = sVar33 + 1;
                          new_cid = new_cid + 1;
                          sVar34 = sVar26;
                        } while (sVar26 != sVar33);
                      }
                      builtin_strncpy(buf_00 + -8,"PW\x12",4);
                      buf_00[-4] = '\0';
                      buf_00[-3] = '\0';
                      buf_00[-2] = '\0';
                      buf_00[-1] = '\0';
                      quicly_local_cid_on_sent(&(conn->super).local.cid_set,sVar34);
                      bVar38 = false;
                      iVar16 = 0;
                      if (iVar17 == 0) {
                        sVar26 = (conn->egress).retire_cid._num_pending;
                        sVar33 = 0;
                        sVar34 = sVar33;
                        if (sVar26 != 0) {
                          do {
                            uVar32 = (conn->egress).retire_cid.sequences[sVar33];
                            buf_00[-8] = -0x75;
                            buf_00[-7] = 'W';
                            buf_00[-6] = '\x12';
                            buf_00[-5] = '\0';
                            buf_00[-4] = '\0';
                            buf_00[-3] = '\0';
                            buf_00[-2] = '\0';
                            buf_00[-1] = '\0';
                            iVar16 = send_retire_connection_id
                                               (conn,(quicly_send_context_t *)local_e8,uVar32);
                            sVar34 = sVar33;
                            if (iVar16 != 0) break;
                            sVar33 = sVar33 + 1;
                            sVar34 = sVar26;
                          } while (sVar26 != sVar33);
                        }
                        buf_00[-8] = -0x58;
                        buf_00[-7] = 'W';
                        buf_00[-6] = '\x12';
                        buf_00[-5] = '\0';
                        buf_00[-4] = '\0';
                        buf_00[-3] = '\0';
                        buf_00[-2] = '\0';
                        buf_00[-1] = '\0';
                        quicly_retire_cid_shift(&(conn->egress).retire_cid,sVar34);
                        bVar38 = false;
                        iVar17 = iVar16;
                        if (iVar16 == 0) {
                          puVar20 = &(conn->egress).pending_flows;
                          *puVar20 = *puVar20 & 0x7f;
                          bVar38 = true;
                          iVar17 = 0;
                        }
                      }
                      if (!bVar38) goto LAB_001252ba;
                    }
                    goto LAB_001257ce;
                  }
                }
              }
              else {
                builtin_strncpy(buf_00 + -8,"hU\x12",4);
                buf_00[-4] = '\0';
                buf_00[-3] = '\0';
                buf_00[-2] = '\0';
                buf_00[-1] = '\0';
                iVar17 = allocate_ack_eliciting_frame
                                   (conn,(quicly_send_context_t *)local_e8,9,
                                    (quicly_sent_t **)local_78,on_ack_max_data);
                if (iVar17 == 0) {
                  uVar32 = (((conn->super).ctx)->transport_params).max_data +
                           (conn->ingress).max_data.bytes_consumed;
                  puVar20 = puStack_90;
                  buf_00[-8] = -0x6f;
                  buf_00[-7] = 'U';
                  buf_00[-6] = '\x12';
                  buf_00[-5] = '\0';
                  buf_00[-4] = '\0';
                  buf_00[-3] = '\0';
                  buf_00[-2] = '\0';
                  buf_00[-1] = '\0';
                  puVar20 = quicly_encode_max_data_frame(puVar20,uVar32);
                  puStack_90 = puVar20;
                  sent = (anon_union_24_13_c7673ae4_for_data *)((long)local_78 + 8);
                  buf_00[-8] = -0x51;
                  buf_00[-7] = 'U';
                  buf_00[-6] = '\x12';
                  buf_00[-5] = '\0';
                  buf_00[-4] = '\0';
                  buf_00[-3] = '\0';
                  buf_00[-2] = '\0';
                  buf_00[-1] = '\0';
                  quicly_maxsender_record
                            (&(conn->ingress).max_data.sender,uVar32,
                             (quicly_maxsender_sent_t *)&sent->packet);
                  puVar1 = &(conn->super).stats.num_frames_sent.max_data;
                  *puVar1 = *puVar1 + 1;
                  if (quicly_trace_fp != (FILE *)0x0) {
                    buf_00[-8] = -0x7f;
                    buf_00[-7] = 'X';
                    buf_00[-6] = '\x12';
                    buf_00[-5] = '\0';
                    buf_00[-4] = '\0';
                    buf_00[-3] = '\0';
                    buf_00[-2] = '\0';
                    buf_00[-1] = '\0';
                    quicly_send_cold_5();
                  }
                  p_Var7 = (conn->super).tracer.cb;
                  if (p_Var7 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
                    iVar18 = (conn->stash).now;
                    pvVar8 = (conn->super).tracer.ctx;
                    buf_00[-8] = -8;
                    buf_00[-7] = 'U';
                    buf_00[-6] = '\x12';
                    buf_00[-5] = '\0';
                    buf_00[-4] = '\0';
                    buf_00[-3] = '\0';
                    buf_00[-2] = '\0';
                    buf_00[-1] = '\0';
                    (*p_Var7)(pvVar8,
                              "{\"type\":\"max-data-send\", \"time\":%lld, \"maximum\":%llu}\n",
                              iVar18,uVar32);
                  }
                  goto LAB_001255f8;
                }
              }
LAB_0012563c:
              bVar38 = false;
            }
          }
        }
      }
    }
    else {
      uVar22 = 0;
      if (conn->initial == (st_quicly_handshake_space_t *)0x0) {
        uVar22 = (uint)(conn->handshake == (st_quicly_handshake_space_t *)0x0);
      }
      uVar3 = (conn->super).remote.transport_params.max_ack_delay;
      (conn->egress).loss.alarm_at = 0x7fffffffffffffff;
      lVar36 = (conn->egress).loss.loss_time;
      if (lVar36 != 0x7fffffffffffffff) {
        builtin_strncpy(buf_00 + -8,"*M\x12",4);
        buf_00[-4] = '\0';
        buf_00[-3] = '\0';
        buf_00[-2] = '\0';
        buf_00[-1] = '\0';
        iVar17 = quicly_loss_detect_loss
                           (&(conn->egress).loss,iVar18,(uint)uVar3,uVar22,on_loss_detected);
        uVar37 = 1;
      }
      else {
        bVar15 = (conn->egress).loss.pto_count;
        (conn->egress).loss.pto_count = bVar15 + 1;
        iVar17 = 0;
        uVar37 = (ulong)(bVar15 < 0x7f) + 1;
      }
      bVar38 = lVar36 == 0x7fffffffffffffff;
      if (iVar17 != 0) {
        bVar38 = false;
        goto LAB_00124d96;
      }
      if ((ulong)local_e8._48_8_ < uVar37) {
        builtin_strncpy(buf_00 + -8,"RX\x12",4);
        buf_00[-4] = '\0';
        buf_00[-3] = '\0';
        buf_00[-2] = '\0';
        buf_00[-1] = '\0';
        __assert_fail("min_packets_to_send <= s->max_datagrams",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x106d,"int do_send(quicly_conn_t *, quicly_send_context_t *)");
      }
      if (lVar36 != 0x7fffffffffffffff) goto LAB_00124912;
      if (quicly_trace_fp != (FILE *)0x0) {
        builtin_strncpy(buf_00 + -8,"TV\x12",4);
        buf_00[-4] = '\0';
        buf_00[-3] = '\0';
        buf_00[-2] = '\0';
        buf_00[-1] = '\0';
        quicly_send_cold_2();
      }
      p_Var7 = (conn->super).tracer.cb;
      if (p_Var7 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
        cVar2 = (conn->egress).loss.pto_count;
        uVar22 = (conn->egress).cc.cwnd;
        pvVar8 = (conn->super).tracer.ctx;
        sVar26 = (conn->egress).loss.sentmap.bytes_in_flight;
        iVar18 = (conn->stash).now;
        buf_00[-8] = -0x3f;
        buf_00[-7] = 'N';
        buf_00[-6] = '\x12';
        buf_00[-5] = '\0';
        buf_00[-4] = '\0';
        buf_00[-3] = '\0';
        buf_00[-2] = '\0';
        buf_00[-1] = '\0';
        (*p_Var7)(pvVar8,
                  "{\"type\":\"pto\", \"time\":%lld, \"inflight\":%llu, \"cwnd\":%llu, \"pto-count\":%lld}\n"
                  ,iVar18,sVar26,(ulong)uVar22,(long)cVar2);
      }
      puVar1 = &(conn->super).stats.num_ptos;
      *puVar1 = *puVar1 + 1;
      local_78 = (undefined1  [8])((conn->egress).max_udp_payload_size * uVar37);
      if (conn->initial == (st_quicly_handshake_space_t *)0x0) {
LAB_00125236:
        if ((local_78 == (undefined1  [8])0x0) ||
           (conn->handshake == (st_quicly_handshake_space_t *)0x0)) {
LAB_0012525d:
          if (local_78 != (undefined1  [8])0x0) {
            builtin_strncpy(buf_00 + -8,"lR\x12",4);
            buf_00[-4] = '\0';
            buf_00[-3] = '\0';
            buf_00[-2] = '\0';
            buf_00[-1] = '\0';
            iVar16 = scheduler_can_send(conn);
            if (iVar16 == 0) {
              buf_00[-8] = -0x5b;
              buf_00[-7] = 'R';
              buf_00[-6] = '\x12';
              buf_00[-5] = '\0';
              buf_00[-4] = '\0';
              buf_00[-3] = '\0';
              buf_00[-2] = '\0';
              buf_00[-1] = '\0';
              iVar17 = mark_frames_on_pto(conn,'\x03',(size_t *)local_78);
              if (iVar17 != 0) goto LAB_001252a9;
            }
          }
          iVar17 = 0;
          bVar27 = true;
        }
        else {
          builtin_strncpy(buf_00 + -8,"YR\x12",4);
          buf_00[-4] = '\0';
          buf_00[-3] = '\0';
          buf_00[-2] = '\0';
          buf_00[-1] = '\0';
          iVar17 = mark_frames_on_pto(conn,'\x02',(size_t *)local_78);
          if (iVar17 == 0) goto LAB_0012525d;
LAB_001252a9:
          bVar27 = false;
        }
      }
      else {
        bVar27 = false;
        buf_00[-8] = -7;
        buf_00[-7] = 'N';
        buf_00[-6] = '\x12';
        buf_00[-5] = '\0';
        buf_00[-4] = '\0';
        buf_00[-3] = '\0';
        buf_00[-2] = '\0';
        buf_00[-1] = '\0';
        iVar17 = mark_frames_on_pto(conn,'\0',(size_t *)local_78);
        if (iVar17 == 0) goto LAB_00125236;
      }
      if (bVar27) goto LAB_00124912;
LAB_001252ba:
      bVar38 = false;
    }
LAB_00124d96:
    iVar16 = 0;
    if (iVar17 != 0xff02) {
      iVar16 = iVar17;
    }
    if (iVar16 == 0) {
      if ((uint8_t *)local_e8._24_8_ != (uint8_t *)0x0) {
        mode = QUICLY_COMMIT_SEND_PACKET_MODE_SMALL;
        if ((*(byte *)local_e8._64_8_ & 0xf0) == 0xc0) {
          mode = (en_quicly_send_packet_mode_t)
                 (bVar38 & (byte)(conn->super).local.bidi.next_stream_id);
        }
        buf_00[-8] = -0x18;
        buf_00[-7] = 'M';
        buf_00[-6] = '\x12';
        buf_00[-5] = '\0';
        buf_00[-4] = '\0';
        buf_00[-3] = '\0';
        buf_00[-2] = '\0';
        buf_00[-1] = '\0';
        commit_send_packet(conn,(quicly_send_context_t *)local_e8,mode);
      }
      if ((conn->application == (st_quicly_application_space_t *)0x0) ||
         ((conn->application->super).unacked_count == 0)) {
        (conn->egress).send_ack_at = 0x7fffffffffffffff;
      }
      builtin_strncpy(buf_00 + -8,"\x1aN\x12",4);
      buf_00[-4] = '\0';
      buf_00[-3] = '\0';
      buf_00[-2] = '\0';
      buf_00[-1] = '\0';
      update_loss_alarm(conn,1);
      if (local_e8._56_8_ != 0) {
        builtin_strncpy(buf_00 + -8,".N\x12",4);
        buf_00[-4] = '\0';
        buf_00[-3] = '\0';
        buf_00[-2] = '\0';
        buf_00[-1] = '\0';
        update_idle_timeout(conn,0);
      }
    }
  }
  else {
    if (quicly_trace_fp != (FILE *)0x0) {
      builtin_strncpy(buf_00 + -8,"\nU\x12",4);
      buf_00[-4] = '\0';
      buf_00[-3] = '\0';
      buf_00[-2] = '\0';
      buf_00[-1] = '\0';
      quicly_send_cold_1();
    }
    (conn->super).state = QUICLY_STATE_DRAINING;
    buf_00[-8] = -0x22;
    buf_00[-7] = 'I';
    buf_00[-6] = '\x12';
    buf_00[-5] = '\0';
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    destroy_all_streams(conn,0,0);
    iVar16 = 0xff03;
  }
LAB_00124e2e:
  if (iVar16 == 0) {
    builtin_strncpy(buf_00 + -8,"HN\x12",4);
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    assert_consistency(conn,1);
    iVar16 = 0;
  }
LAB_00124f56:
  builtin_strncpy(buf_00 + -8,"^O\x12",4);
  buf_00[-4] = '\0';
  buf_00[-3] = '\0';
  buf_00[-2] = '\0';
  buf_00[-1] = '\0';
  clear_datagram_frame_payloads(conn);
  if (local_e8._56_8_ != 0) {
    uVar11 = *(undefined8 *)&(conn->super).remote.address;
    uVar12 = *(undefined8 *)((long)&(conn->super).remote.address + 8);
    uVar13 = *(undefined8 *)((long)&(conn->super).remote.address + 0x14);
    *(undefined8 *)((local_100->sa).sa_data + 10) =
         *(undefined8 *)((long)&(conn->super).remote.address + 0xc);
    *(undefined8 *)((long)&(local_100->sin6).sin6_addr.__in6_u + 0xc) = uVar13;
    *(undefined8 *)local_100 = uVar11;
    *(undefined8 *)((local_100->sa).sa_data + 6) = uVar12;
    uVar11 = *(undefined8 *)&(conn->super).local.address;
    uVar12 = *(undefined8 *)((long)&(conn->super).local.address + 8);
    uVar13 = *(undefined8 *)((long)&(conn->super).local.address + 0x14);
    *(undefined8 *)((src->sa).sa_data + 10) =
         *(undefined8 *)((long)&(conn->super).local.address + 0xc);
    *(undefined8 *)((long)&(src->sin6).sin6_addr.__in6_u + 0xc) = uVar13;
    *(undefined8 *)src = uVar11;
    *(undefined8 *)((src->sa).sa_data + 6) = uVar12;
  }
  *num_datagrams = local_e8._56_8_;
  buf_00[-8] = -0x47;
  buf_00[-7] = 'O';
  buf_00[-6] = '\x12';
  buf_00[-5] = '\0';
  buf_00[-4] = '\0';
  buf_00[-3] = '\0';
  buf_00[-2] = '\0';
  buf_00[-1] = '\0';
  unlock_now(conn);
  return iVar16;
}

Assistant:

int quicly_send(quicly_conn_t *conn, quicly_address_t *dest, quicly_address_t *src, struct iovec *datagrams, size_t *num_datagrams,
                void *buf, size_t bufsize)
{
    quicly_send_context_t s = {{NULL, -1}, {}, datagrams, *num_datagrams, 0, {buf, (uint8_t *)buf + bufsize}};
    int ret;

    lock_now(conn, 0);

    /* bail out if there's nothing is scheduled to be sent */
    if (conn->stash.now < quicly_get_first_timeout(conn)) {
        ret = 0;
        goto Exit;
    }

    QUICLY_PROBE(SEND, conn, conn->stash.now, conn->super.state,
                 QUICLY_PROBE_HEXDUMP(conn->super.remote.cid_set.cids[0].cid.cid, conn->super.remote.cid_set.cids[0].cid.len));

    if (conn->super.state >= QUICLY_STATE_CLOSING) {
        quicly_sentmap_iter_t iter;
        init_acks_iter(conn, &iter);
        /* check if the connection can be closed now (after 3 pto) */
        if (conn->super.state == QUICLY_STATE_DRAINING ||
            conn->super.stats.num_frames_sent.transport_close + conn->super.stats.num_frames_sent.application_close != 0) {
            if (quicly_sentmap_get(&iter)->packet_number == UINT64_MAX) {
                assert(quicly_num_streams(conn) == 0);
                ret = QUICLY_ERROR_FREE_CONNECTION;
                goto Exit;
            }
        }
        if (conn->super.state == QUICLY_STATE_CLOSING && conn->egress.send_ack_at <= conn->stash.now) {
            /* destroy all streams; doing so is delayed until the emission of CONNECTION_CLOSE frame to allow quicly_close to be
             * called from a stream handler */
            destroy_all_streams(conn, 0, 0);
            /* send CONNECTION_CLOSE in all possible epochs */
            for (size_t epoch = 0; epoch < QUICLY_NUM_EPOCHS; ++epoch) {
                if ((ret = send_connection_close(conn, epoch, &s)) != 0)
                    goto Exit;
            }
            if ((ret = commit_send_packet(conn, &s, QUICLY_COMMIT_SEND_PACKET_MODE_SMALL)) != 0)
                goto Exit;
        }
        /* wait at least 1ms */
        if ((conn->egress.send_ack_at = quicly_sentmap_get(&iter)->sent_at + get_sentmap_expiration_time(conn)) <= conn->stash.now)
            conn->egress.send_ack_at = conn->stash.now + 1;
        ret = 0;
        goto Exit;
    }

    /* emit packets */
    if ((ret = do_send(conn, &s)) != 0)
        goto Exit;

    assert_consistency(conn, 1);

Exit:
    clear_datagram_frame_payloads(conn);
    if (s.num_datagrams != 0) {
        *dest = conn->super.remote.address;
        *src = conn->super.local.address;
    }
    *num_datagrams = s.num_datagrams;
    unlock_now(conn);
    return ret;
}